

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O3

ReadOnlyUnicodeString __thiscall Strings::convert(Strings *this,FastString *string)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  CharPointer in_RDX;
  CharPointer extraout_RDX;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ReadOnlyUnicodeString RVar12;
  
  uVar3 = (string->super_tagbstring).slen;
  uVar6 = uVar3 + 1;
  if (uVar6 == 0) {
    *(undefined4 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    *(uint *)this = uVar6;
    puVar4 = (uint *)operator_new__((ulong)uVar6 << 2);
    *(uint **)(this + 8) = puVar4;
    puVar5 = puVar4;
    in_RDX = extraout_RDX;
    if (0 < (int)uVar3) {
      in_RDX = (CharPointer)(string->super_tagbstring).data;
      iVar7 = 0;
      do {
        lVar8 = (long)iVar7;
        iVar7 = iVar7 + 1;
        bVar2 = *(byte *)((long)in_RDX + lVar8);
        uVar10 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          if ((bVar2 & 0x40) == 0) {
            iVar9 = 0;
            uVar10 = 0x7f;
          }
          else {
            uVar10 = 0x7f;
            uVar11 = 0x40;
            iVar9 = 0;
            do {
              iVar9 = iVar9 + 1;
              uVar10 = uVar10 >> 1;
              uVar11 = uVar11 >> 1;
            } while ((uVar11 & bVar2) != 0);
          }
          lVar8 = (long)iVar7;
          uVar11 = uVar10 & bVar2;
          do {
            uVar10 = uVar11;
            iVar7 = (int)lVar8;
            if ((iVar9 < 1) || ((long)(ulong)uVar3 <= lVar8)) break;
            iVar9 = iVar9 + -1;
            pbVar1 = (byte *)((long)in_RDX + lVar8);
            lVar8 = lVar8 + 1;
            uVar11 = *pbVar1 & 0x3f | uVar10 << 6;
          } while ((*pbVar1 & 0xffffffc0) == 0x80);
        }
        *puVar5 = uVar10;
        puVar5 = puVar5 + 1;
      } while (iVar7 < (int)uVar3);
    }
    *puVar5 = 0;
    iVar7 = (int)((ulong)((long)puVar5 - (long)puVar4) >> 2);
    if (iVar7 <= (int)uVar6) {
      *(int *)this = iVar7;
    }
  }
  RVar12.data = in_RDX;
  RVar12._0_8_ = this;
  return RVar12;
}

Assistant:

ReadOnlyUnicodeString convert(const FastString & string)
    {
        // Create some space for the UCS-2 string
        ReadOnlyUnicodeString ret(0, string.getLength() + 1);
        ReadOnlyUnicodeString::CharType * data = const_cast<ReadOnlyUnicodeString::CharType *>(ret.getData());
        if (!data) return ret;

        ReadOnlyUnicodeString::CharType * dest = data;

        // Direct access to the buffer (don't bound check for every access)
        const uint8 * buffer = (const uint8*)string;
        for (int i = 0; i < string.getLength();)
        {
            // Get the current char
            const uint8 c = buffer [i++];

            // Check for UTF8 code
            if ((c & 0x80) != 0)
            {
                // The data is in the 7 low bits
                uint32 dataMask = 0x7f;
                // The count bit mask
                uint32 bitCountMask = 0x40;
                // The consumption count
                int charCount = 0;

                while ((c & bitCountMask) != 0 && bitCountMask)
                {
                    ++charCount;
                    dataMask >>= 1; bitCountMask >>= 1;
                }

                // Get the few bits remaining here
                int n = (c & dataMask);

                // Then extract the remaining bits
                while (--charCount >= 0 && i < string.getLength())
                {
                    const uint8 extra = buffer[i];
                    // Make sure it's a valid UTF8 encoding
                    if ((extra & 0xc0) != 0x80) break;

                    // Store the new bits too
                    n <<= 6; n |= (extra & 0x3f);
                    ++i;
                }

                *dest++ = (ReadOnlyUnicodeString::CharType)n;
            }
            else // Append the char as-is
                *dest++ = (ReadOnlyUnicodeString::CharType)c;
        }

        // Store the last zero byte
        *dest = 0;
        // Create the returned object
        ret.limitTo((int)(dest - data));
        return ret;
    }